

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

void __thiscall cmFileAPI::ReadClientQuery(cmFileAPI *this,string *client,ClientQueryJson *q)

{
  bool bVar1;
  Value *pVVar2;
  Value query;
  string queryFile;
  Value local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ClientRequests local_58;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                 &this->APIv1,"/query/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                 client);
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                 "/query.json");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a0);
  Json::Value::Value(&local_a0,nullValue);
  bVar1 = ReadJsonFile(this,&local_78,&local_a0,&q->Error);
  if (bVar1) {
    bVar1 = Json::Value::isObject(&local_a0);
    if (bVar1) {
      pVVar2 = Json::Value::operator[](&local_a0,"client");
      bVar1 = Json::Value::isNull(pVVar2);
      if (!bVar1) {
        Json::Value::operator=(&q->ClientValue,pVVar2);
      }
      pVVar2 = Json::Value::operator[](&local_a0,"requests");
      Json::Value::operator=(&q->RequestsValue,pVVar2);
      BuildClientRequests(&local_58,this,&q->RequestsValue);
      ClientRequests::operator=(&q->Requests,&local_58);
      ClientRequests::~ClientRequests(&local_58);
    }
    else {
      std::__cxx11::string::assign((char *)q);
    }
  }
  Json::Value::~Value(&local_a0);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void cmFileAPI::ReadClientQuery(std::string const& client, ClientQueryJson& q)
{
  // Read the query.json file.
  std::string queryFile = this->APIv1 + "/query/" + client + "/query.json";
  Json::Value query;
  if (!this->ReadJsonFile(queryFile, query, q.Error)) {
    return;
  }
  if (!query.isObject()) {
    q.Error = "query root is not an object";
    return;
  }

  Json::Value const& clientValue = query["client"];
  if (!clientValue.isNull()) {
    q.ClientValue = clientValue;
  }
  q.RequestsValue = std::move(query["requests"]);
  q.Requests = this->BuildClientRequests(q.RequestsValue);
}